

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3ScratchMalloc(int n)

{
  ScratchFreeslot *pSVar1;
  int iVar2;
  ScratchFreeslot *in_RAX;
  void *pvVar3;
  ScratchFreeslot *local_18;
  
  local_18 = in_RAX;
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  if ((mem0.nScratchFree == 0) || (sqlite3Config.szScratch < n)) {
    if (sqlite3Config.bMemstat == 0) {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
      }
      pvVar3 = (*sqlite3Config.m.xMalloc)(n);
      return pvVar3;
    }
    if (sqlite3Stat.mxValue[8] < n) {
      sqlite3Stat.mxValue[8] = n;
    }
    sqlite3Stat.nowValue[8] = n;
    iVar2 = mallocWithAlarm(n,&local_18);
    pSVar1 = mem0.pScratchFree;
    if (local_18 != (ScratchFreeslot *)0x0) {
      sqlite3Stat.nowValue[4] = iVar2 + sqlite3Stat.nowValue[4];
      if (sqlite3Stat.mxValue[4] < sqlite3Stat.nowValue[4]) {
        sqlite3Stat.mxValue[4] = sqlite3Stat.nowValue[4];
      }
    }
  }
  else {
    mem0.nScratchFree = mem0.nScratchFree - 1;
    iVar2 = sqlite3Stat.nowValue[3] + 1;
    if (sqlite3Stat.mxValue[3] <= sqlite3Stat.nowValue[3]) {
      sqlite3Stat.mxValue[3] = iVar2;
    }
    local_18 = mem0.pScratchFree;
    sqlite3Stat.nowValue[3] = iVar2;
    sqlite3Stat.nowValue[8] = n;
    pSVar1 = (mem0.pScratchFree)->pNext;
    if (sqlite3Stat.mxValue[8] < n) {
      sqlite3Stat.mxValue[8] = n;
    }
  }
  mem0.pScratchFree = pSVar1;
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ScratchMalloc(int n){
  void *p;
  assert( n>0 );

  sqlite3_mutex_enter(mem0.mutex);
  if( mem0.nScratchFree && sqlite3GlobalConfig.szScratch>=n ){
    p = mem0.pScratchFree;
    mem0.pScratchFree = mem0.pScratchFree->pNext;
    mem0.nScratchFree--;
    sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_USED, 1);
    sqlite3StatusSet(SQLITE_STATUS_SCRATCH_SIZE, n);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    if( sqlite3GlobalConfig.bMemstat ){
      sqlite3StatusSet(SQLITE_STATUS_SCRATCH_SIZE, n);
      n = mallocWithAlarm(n, &p);
      if( p ) sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_OVERFLOW, n);
      sqlite3_mutex_leave(mem0.mutex);
    }else{
      sqlite3_mutex_leave(mem0.mutex);
      p = sqlite3GlobalConfig.m.xMalloc(n);
    }
    sqlite3MemdebugSetType(p, MEMTYPE_SCRATCH);
  }
  assert( sqlite3_mutex_notheld(mem0.mutex) );


#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
  /* Verify that no more than two scratch allocations per thread
  ** are outstanding at one time.  (This is only checked in the
  ** single-threaded case since checking in the multi-threaded case
  ** would be much more complicated.) */
  assert( scratchAllocOut<=1 );
  if( p ) scratchAllocOut++;
#endif

  return p;
}